

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O3

ChanopenResult *
ssh2_connection_parse_channel_open
          (ChanopenResult *__return_storage_ptr__,ssh2_connection_state *s,ptrlen type,PktIn *pktin,
          SshChannel *sc)

{
  LogContext *pLVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  unsigned_long uVar5;
  char *pcVar6;
  unsigned_long uVar7;
  void *pvVar8;
  Socket *s_00;
  Channel *pCVar9;
  char *pcVar10;
  BinarySource *src;
  ptrlen pVar11;
  ptrlen pVar12;
  ssh_rportfwd pf;
  Channel *local_70;
  undefined8 local_68;
  char *local_60;
  
  _Var2 = ptrlen_eq_string(type,"x11");
  if (_Var2) {
    pVar11 = BinarySource_get_string(pktin->binarysource_);
    uVar5 = BinarySource_get_uint32(pktin->binarysource_);
    pLVar1 = (s->ppl).logctx;
    uVar3 = string_length_for_printf(pVar11.len);
    pcVar6 = dupprintf("Received X11 connect request from %.*s:%d",(ulong)uVar3,pVar11.ptr,
                       uVar5 & 0xffffffff);
    logevent_and_free(pLVar1,pcVar6);
    if ((s->X11_fwd_enabled != false) || (s->connshare != (ssh_sharing_state *)0x0)) {
      if (pVar11.ptr == (void *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = mkstr(pVar11);
      }
      pCVar9 = x11_new_channel(s->x11authtree,sc,pcVar6,(int)uVar5,
                               s->connshare != (ssh_sharing_state *)0x0);
      safefree(pcVar6);
      pLVar1 = (s->ppl).logctx;
      pcVar6 = dupprintf("Opened X11 forward channel");
      logevent_and_free(pLVar1,pcVar6);
      __return_storage_ptr__->outcome = CHANOPEN_RESULT_SUCCESS;
      (__return_storage_ptr__->u).failure.wire_message = (char *)pCVar9;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
    (__return_storage_ptr__->u).failure.reason_code = 1;
    pcVar6 = "X11 forwarding is not enabled";
  }
  else {
    _Var2 = ptrlen_eq_string(type,"forwarded-tcpip");
    if (_Var2) {
      src = pktin->binarysource_;
      pVar11 = BinarySource_get_string(src);
      uVar5 = BinarySource_get_uint32(src);
      pVar12 = BinarySource_get_string(src);
      uVar7 = BinarySource_get_uint32(src);
      pLVar1 = (s->ppl).logctx;
      uVar3 = string_length_for_printf(pVar11.len);
      uVar4 = string_length_for_printf(pVar12.len);
      pcVar6 = dupprintf("Received remote port %.*s:%d open request from %.*s:%d",(ulong)uVar3,
                         pVar11.ptr,uVar5 & 0xffffffff,(ulong)uVar4,pVar12.ptr,(int)uVar7);
      logevent_and_free(pLVar1,pcVar6);
      local_60 = mkstr(pVar11);
      local_68._0_4_ = (int)uVar5;
      pvVar8 = find234(s->rportfwds,&local_68,(cmpfn234)0x0);
      safefree(local_60);
      if (pvVar8 == (void *)0x0) {
        __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
        (__return_storage_ptr__->u).failure.reason_code = 1;
        pcVar6 = "Remote port is not recognised";
      }
      else {
        pCVar9 = *(Channel **)((long)pvVar8 + 0x28);
        if (pCVar9 != (Channel *)0x0) {
          __return_storage_ptr__->outcome = CHANOPEN_RESULT_DOWNSTREAM;
          local_70 = pCVar9;
          goto LAB_00133ef6;
        }
        pcVar6 = portfwdmgr_connect(s->portfwdmgr,&local_70,*(char **)((long)pvVar8 + 0x10),
                                    *(int *)((long)pvVar8 + 4),sc,*(int *)((long)pvVar8 + 0x18));
        pLVar1 = (s->ppl).logctx;
        pcVar10 = dupprintf("Attempting to forward remote port to %s:%d",
                            *(undefined8 *)((long)pvVar8 + 0x10),(ulong)*(uint *)((long)pvVar8 + 4))
        ;
        logevent_and_free(pLVar1,pcVar10);
        pLVar1 = (s->ppl).logctx;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = dupprintf("Forwarded port opened successfully");
          logevent_and_free(pLVar1,pcVar6);
          __return_storage_ptr__->outcome = CHANOPEN_RESULT_SUCCESS;
          goto LAB_00133ef6;
        }
        pcVar10 = dupprintf("Port open failed: %s",pcVar6);
        logevent_and_free(pLVar1,pcVar10);
        safefree(pcVar6);
        __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
        (__return_storage_ptr__->u).failure.reason_code = 2;
        pcVar6 = "Port open failed";
      }
    }
    else {
      _Var2 = ptrlen_eq_string(type,"auth-agent@openssh.com");
      if (_Var2) {
        _Var2 = (*((s->cl).vt)->agent_forwarding_permitted)(&s->cl);
        if (_Var2) {
          pCVar9 = portfwd_raw_new(&s->cl,(Plug **)&local_68,true);
          s_00 = agent_connect((Plug *)CONCAT44(local_68._4_4_,(undefined4)local_68));
          pcVar6 = (*s_00->vt->socket_error)(s_00);
          if (pcVar6 == (char *)0x0) {
            portfwd_raw_setup(pCVar9,s_00,sc);
          }
          else {
            portfwd_raw_free(pCVar9);
            pCVar9 = agentf_new(sc);
          }
          __return_storage_ptr__->outcome = CHANOPEN_RESULT_SUCCESS;
          (__return_storage_ptr__->u).failure.wire_message = (char *)pCVar9;
          return __return_storage_ptr__;
        }
        __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
        (__return_storage_ptr__->u).failure.reason_code = 1;
        pcVar6 = "Agent forwarding is not enabled";
      }
      else {
        __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
        (__return_storage_ptr__->u).failure.reason_code = 3;
        pcVar6 = "Unsupported channel type requested";
      }
    }
  }
  local_70 = (Channel *)dupprintf(pcVar6);
LAB_00133ef6:
  (__return_storage_ptr__->u).failure.wire_message = (char *)local_70;
  return __return_storage_ptr__;
}

Assistant:

ChanopenResult ssh2_connection_parse_channel_open(
    struct ssh2_connection_state *s, ptrlen type,
    PktIn *pktin, SshChannel *sc)
{
    if (ptrlen_eq_string(type, "x11")) {
        ptrlen peeraddr = get_string(pktin);
        int peerport = get_uint32(pktin);

        return chan_open_x11(s, sc, peeraddr, peerport);
    } else if (ptrlen_eq_string(type, "forwarded-tcpip")) {
        ptrlen fwdaddr = get_string(pktin);
        int fwdport = toint(get_uint32(pktin));
        ptrlen peeraddr = get_string(pktin);
        int peerport = toint(get_uint32(pktin));

        return chan_open_forwarded_tcpip(
            s, sc, fwdaddr, fwdport, peeraddr, peerport);
    } else if (ptrlen_eq_string(type, "auth-agent@openssh.com")) {
        return chan_open_auth_agent(s, sc);
    } else {
        CHANOPEN_RETURN_FAILURE(
            SSH2_OPEN_UNKNOWN_CHANNEL_TYPE,
            ("Unsupported channel type requested"));
    }
}